

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall
icu_63::DateTimePatternGenerator::setDecimalSymbols
          (DateTimePatternGenerator *this,Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString local_b70;
  undefined1 local_b20 [8];
  DecimalFormatSymbols dfs;
  UErrorCode *status_local;
  Locale *locale_local;
  DateTimePatternGenerator *this_local;
  
  dfs._2808_8_ = status;
  DecimalFormatSymbols::DecimalFormatSymbols((DecimalFormatSymbols *)local_b20,locale,status);
  UVar1 = ::U_SUCCESS(*(UErrorCode *)dfs._2808_8_);
  if (UVar1 != '\0') {
    DecimalFormatSymbols::getSymbol
              (&local_b70,(DecimalFormatSymbols *)local_b20,kDecimalSeparatorSymbol);
    icu_63::UnicodeString::operator=(&this->decimal,&local_b70);
    icu_63::UnicodeString::~UnicodeString(&local_b70);
    icu_63::UnicodeString::getTerminatedBuffer(&this->decimal);
  }
  DecimalFormatSymbols::~DecimalFormatSymbols((DecimalFormatSymbols *)local_b20);
  return;
}

Assistant:

void
DateTimePatternGenerator::setDecimalSymbols(const Locale& locale, UErrorCode& status) {
    DecimalFormatSymbols dfs = DecimalFormatSymbols(locale, status);
    if(U_SUCCESS(status)) {
        decimal = dfs.getSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol);
        // NUL-terminate for the C API.
        decimal.getTerminatedBuffer();
    }
}